

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

void extent_heap_insert(extent_heap_t *ph,extent_t *phn)

{
  extent_t *peVar1;
  extent_t *peVar2;
  
  (phn->ph_link).phn_prev = (extent_t *)0x0;
  (phn->ph_link).phn_next = (extent_t *)0x0;
  (phn->ph_link).phn_lchild = (extent_t *)0x0;
  peVar1 = ph->ph_root;
  if (peVar1 != (extent_t *)0x0) {
    (phn->ph_link).phn_next = (peVar1->ph_link).phn_next;
    peVar2 = (peVar1->ph_link).phn_next;
    if (peVar2 != (extent_t *)0x0) {
      (peVar2->ph_link).phn_prev = phn;
    }
    (phn->ph_link).phn_prev = peVar1;
    ph = (extent_heap_t *)&(peVar1->ph_link).phn_next;
  }
  *ph = (extent_heap_t)phn;
  return;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}